

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testThreads.c
# Opt level: O0

void * thread_specific_data(void *private_data)

{
  char *__s1;
  int iVar1;
  undefined4 *puVar2;
  long *plVar3;
  long lVar4;
  int *piVar5;
  uint local_2c;
  int okay;
  char *filename;
  xmlThreadParams *params;
  xmlDocPtr myDoc;
  void *private_data_local;
  
  __s1 = *private_data;
  iVar1 = strcmp(__s1,"test/threads/invalid.xml");
  if (iVar1 == 0) {
    puVar2 = (undefined4 *)__xmlDoValidityCheckingDefaultValue();
    *puVar2 = 0;
    lVar4 = _stdout;
    plVar3 = (long *)__xmlGenericErrorContext();
    *plVar3 = lVar4;
  }
  else {
    puVar2 = (undefined4 *)__xmlDoValidityCheckingDefaultValue();
    *puVar2 = 1;
    lVar4 = _stderr;
    plVar3 = (long *)__xmlGenericErrorContext();
    *plVar3 = lVar4;
  }
  lVar4 = xmlParseFile(__s1);
  if (lVar4 == 0) {
    printf("parse failed\n");
  }
  else {
    xmlFreeDoc(lVar4);
  }
  local_2c = (uint)(lVar4 != 0);
  iVar1 = strcmp(__s1,"test/threads/invalid.xml");
  if (iVar1 == 0) {
    piVar5 = (int *)__xmlDoValidityCheckingDefaultValue();
    if (*piVar5 != 0) {
      printf("ValidityCheckingDefaultValue override failed\n");
      local_2c = 0;
    }
    plVar3 = (long *)__xmlGenericErrorContext();
    if (*plVar3 != _stdout) {
      printf("xmlGenericErrorContext override failed\n");
      local_2c = 0;
    }
  }
  else {
    piVar5 = (int *)__xmlDoValidityCheckingDefaultValue();
    if (*piVar5 != 1) {
      printf("ValidityCheckingDefaultValue override failed\n");
      local_2c = 0;
    }
    plVar3 = (long *)__xmlGenericErrorContext();
    if (*plVar3 != _stderr) {
      printf("xmlGenericErrorContext override failed\n");
      local_2c = 0;
    }
  }
  *(uint *)((long)private_data + 8) = local_2c;
  return (void *)0x0;
}

Assistant:

static void *
thread_specific_data(void *private_data)
{
    xmlDocPtr myDoc;
    xmlThreadParams *params = (xmlThreadParams *) private_data;
    const char *filename = params->filename;
    int okay = 1;

    if (!strcmp(filename, "test/threads/invalid.xml")) {
        xmlDoValidityCheckingDefaultValue = 0;
        xmlGenericErrorContext = stdout;
    } else {
        xmlDoValidityCheckingDefaultValue = 1;
        xmlGenericErrorContext = stderr;
    }
#ifdef LIBXML_SAX1_ENABLED
    myDoc = xmlParseFile(filename);
#else
    myDoc = xmlReadFile(filename, NULL, XML_WITH_CATALOG);
#endif
    if (myDoc) {
        xmlFreeDoc(myDoc);
    } else {
        printf("parse failed\n");
	okay = 0;
    }
    if (!strcmp(filename, "test/threads/invalid.xml")) {
        if (xmlDoValidityCheckingDefaultValue != 0) {
	    printf("ValidityCheckingDefaultValue override failed\n");
	    okay = 0;
	}
        if (xmlGenericErrorContext != stdout) {
	    printf("xmlGenericErrorContext override failed\n");
	    okay = 0;
	}
    } else {
        if (xmlDoValidityCheckingDefaultValue != 1) {
	    printf("ValidityCheckingDefaultValue override failed\n");
	    okay = 0;
	}
        if (xmlGenericErrorContext != stderr) {
	    printf("xmlGenericErrorContext override failed\n");
	    okay = 0;
	}
    }
    params->okay = okay;
    return(NULL);
}